

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

void add_pax_attr_binary(archive_string *as,char *key,char *value,size_t value_len)

{
  size_t sVar1;
  char *p;
  char tmp [13];
  int next_ten;
  int len;
  int i;
  int digits;
  size_t value_len_local;
  char *value_local;
  char *key_local;
  archive_string *as_local;
  
  sVar1 = strlen(key);
  tmp[5] = '\x01';
  tmp[6] = '\0';
  tmp[7] = '\0';
  tmp[8] = '\0';
  len = 0;
  tmp._9_4_ = (int)sVar1 + (int)value_len + 3;
  for (next_ten = tmp._9_4_; 0 < next_ten; next_ten = next_ten / 10) {
    len = len + 1;
    tmp._5_4_ = tmp._5_4_ * 10;
  }
  if ((int)tmp._5_4_ <= tmp._9_4_ + len) {
    len = len + 1;
  }
  tmp[4] = '\0';
  p = format_int(tmp + 4,(long)(tmp._9_4_ + len));
  archive_strcat(as,p);
  archive_strappend_char(as,' ');
  archive_strcat(as,key);
  archive_strappend_char(as,'=');
  archive_array_append(as,value,value_len);
  archive_strappend_char(as,'\n');
  return;
}

Assistant:

static void
add_pax_attr_binary(struct archive_string *as, const char *key,
		    const char *value, size_t value_len)
{
	int digits, i, len, next_ten;
	char tmp[1 + 3 * sizeof(int)];	/* < 3 base-10 digits per byte */

	/*-
	 * PAX attributes have the following layout:
	 *     <len> <space> <key> <=> <value> <nl>
	 */
	len = 1 + (int)strlen(key) + 1 + (int)value_len + 1;

	/*
	 * The <len> field includes the length of the <len> field, so
	 * computing the correct length is tricky.  I start by
	 * counting the number of base-10 digits in 'len' and
	 * computing the next higher power of 10.
	 */
	next_ten = 1;
	digits = 0;
	i = len;
	while (i > 0) {
		i = i / 10;
		digits++;
		next_ten = next_ten * 10;
	}
	/*
	 * For example, if string without the length field is 99
	 * chars, then adding the 2 digit length "99" will force the
	 * total length past 100, requiring an extra digit.  The next
	 * statement adjusts for this effect.
	 */
	if (len + digits >= next_ten)
		digits++;

	/* Now, we have the right length so we can build the line. */
	tmp[sizeof(tmp) - 1] = 0;	/* Null-terminate the work area. */
	archive_strcat(as, format_int(tmp + sizeof(tmp) - 1, len + digits));
	archive_strappend_char(as, ' ');
	archive_strcat(as, key);
	archive_strappend_char(as, '=');
	archive_array_append(as, value, value_len);
	archive_strappend_char(as, '\n');
}